

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

void Saig_ManFilterUsingInd(Aig_Man_t *p,Vec_Vec_t *vCands,int nConfs,int nProps,int fVerbose)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  Aig_Man_t *p_00;
  Aig_Man_t *p_01;
  sat_solver *pSat;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *p_02;
  int in_R9D;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  p_00 = Saig_ManCreateIndMiter(p,vCands);
  if ((long)vCands->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + *(int *)((long)vCands->pArray[lVar6] + 4);
      lVar6 = lVar6 + 1;
    } while (vCands->nSize != lVar6);
  }
  if (p_00->nObjs[3] != iVar4) {
    __assert_fail("Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigConstr2.c"
                  ,0x166,"void Saig_ManFilterUsingInd(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
  }
  p_01 = (Aig_Man_t *)Cnf_DeriveSimple(p_00,p_00->nObjs[3]);
  p_02 = (char *)p_01;
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)p_01,1,0);
  if (fVerbose != 0) {
    p_02 = "Filtered cands:  ";
    printf("Filtered cands:  ");
  }
  if (0 < vCands->nSize) {
    lVar6 = 0;
    iVar4 = 0;
    do {
      pvVar1 = vCands->pArray[lVar6];
      iVar3 = *(int *)((long)pvVar1 + 4);
      if (iVar3 < 1) {
        iVar8 = 0;
      }
      else {
        lVar7 = 0;
        uVar9 = 0;
        do {
          uVar2 = *(ulong *)(*(long *)((long)pvVar1 + 8) + lVar7 * 8);
          iVar3 = Saig_ManFilterUsingIndOne_new
                            ((Aig_Man_t *)p_02,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,
                             iVar4 + (int)lVar7);
          if (iVar3 != 0) {
            iVar3 = (int)uVar9;
            if ((iVar3 < 0) || (*(int *)((long)pvVar1 + 4) <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            *(ulong *)(*(long *)((long)pvVar1 + 8) + uVar9 * 8) = uVar2;
            if (fVerbose != 0) {
              pcVar5 = "!";
              if ((uVar2 & 1) == 0) {
                pcVar5 = "";
              }
              p_02 = "%d:%s%d  ";
              printf("%d:%s%d  ",lVar6,pcVar5,(ulong)*(uint *)((uVar2 & 0xfffffffffffffffe) + 0x24))
              ;
            }
            uVar9 = (ulong)(iVar3 + 1);
          }
          iVar8 = (int)uVar9;
          lVar7 = lVar7 + 1;
          iVar3 = *(int *)((long)pvVar1 + 4);
        } while (lVar7 < iVar3);
        iVar4 = iVar4 + (int)lVar7;
      }
      if (iVar3 < iVar8) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      *(int *)((long)pvVar1 + 4) = iVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vCands->nSize);
  }
  if (fVerbose == 0) {
    Cnf_DataFree((Cnf_Dat_t *)p_01);
    sat_solver_delete(pSat);
  }
  else {
    putchar(10);
    Cnf_DataFree((Cnf_Dat_t *)p_01);
    sat_solver_delete(pSat);
    Aig_ManPrintStats(p_00);
  }
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Saig_ManFilterUsingInd( Aig_Man_t * p, Vec_Vec_t * vCands, int nConfs, int nProps, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, k, k2, Counter;
/*
    Vec_VecForEachLevel( vCands, vNodes, i )
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
            printf( "%d ", Aig_ObjId(Aig_Regular(pObj)) );
    printf( "\n" );
*/
    // create timeframes
//    pFrames = Saig_ManUnrollInd( p );
    pFrames = Saig_ManCreateIndMiter( p, vCands );
    assert( Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands) );
    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // check candidates
    if ( fVerbose )
        printf( "Filtered cands:  " );
    Counter = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        k2 = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            if ( Saig_ManFilterUsingIndOne_new( p, pFrames, pSat, pCnf, nConfs, nProps, Counter++ ) )
//            if ( Saig_ManFilterUsingIndOne_old( p, pSat, pCnf, nConfs, pObj ) )
            {
                Vec_PtrWriteEntry( vNodes, k2++, pObj );
                if ( fVerbose )
                    printf( "%d:%s%d  ", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            }
        }
        Vec_PtrShrink( vNodes, k2 );
    }
    if ( fVerbose )
        printf( "\n" );
    // clean up
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( fVerbose )
        Aig_ManPrintStats( pFrames );
    Aig_ManStop( pFrames );
}